

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O0

string * __thiscall soplex::SLUFactorRational::statistics_abi_cxx11_(SLUFactorRational *this)

{
  _Setw _Var1;
  int iVar2;
  _Setprecision _Var3;
  ostream *poVar4;
  void *pvVar5;
  SLUFactorRational *in_RSI;
  string *in_RDI;
  Real RVar6;
  stringstream s;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar4 = std::operator<<(local_188,"Factorizations     : ");
  _Var1 = std::setw(10);
  poVar4 = std::operator<<(poVar4,_Var1);
  iVar2 = (*(in_RSI->super_SLinSolverRational)._vptr_SLinSolverRational[10])();
  pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"  Time spent       : ");
  _Var1 = std::setw(10);
  poVar4 = std::operator<<(poVar4,_Var1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::fixed);
  _Var3 = std::setprecision(2);
  poVar4 = std::operator<<(poVar4,_Var3);
  RVar6 = getFactorTime((SLUFactorRational *)0x19a3b8);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,RVar6);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"Solves             : ");
  _Var1 = std::setw(10);
  poVar4 = std::operator<<(poVar4,_Var1);
  iVar2 = getSolveCount(in_RSI);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"  Time spent       : ");
  _Var1 = std::setw(10);
  poVar4 = std::operator<<(poVar4,_Var1);
  RVar6 = getSolveTime((SLUFactorRational *)0x19a4d2);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,RVar6);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

inline std::string SLUFactorRational::statistics() const
{
   std::stringstream s;
   s  << "Factorizations     : " << std::setw(10) << getFactorCount() << std::endl
      << "  Time spent       : " << std::setw(10) << std::fixed << std::setprecision(
         2) << getFactorTime() << std::endl
      << "Solves             : " << std::setw(10) << getSolveCount() << std::endl
      << "  Time spent       : " << std::setw(10) << getSolveTime() << std::endl;

   return s.str();
}